

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O0

void __thiscall cppforth::Forth::readFile(Forth *this)

{
  undefined4 dst;
  byte bVar1;
  uint uVar2;
  uint Value;
  element_type *peVar3;
  reference pvVar4;
  Cell realLengthF;
  Cell realLength;
  iostate status;
  vector<char,_std::allocator<char>_> readBuffer;
  uint caddr;
  size_t length;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  uint h;
  Forth *this_local;
  
  requireDStackDepth(this,3,"READ-FILE");
  f.
  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  uVar2 = f.
          super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"READ-FILE",&local_49);
  GetFileHandle((Forth *)local_28,(Cell)this,(string *)(ulong)uVar2,(errorCodes)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack);
  readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
       ForthStack<unsigned_int>::getTop(&this->dStack,1);
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&status,(ulong)uVar2,
             (allocator_type *)((long)&realLength + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&realLength + 3));
  peVar3 = std::
           __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
  std::ios::clear((int)peVar3 + (int)*(undefined8 *)(*(long *)peVar3 + -0x18));
  peVar3 = std::
           __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
  pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)&status,0);
  std::istream::read((char *)peVar3,(long)pvVar4);
  std::
  __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_28);
  std::ios::rdstate();
  pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)&status,0);
  strlen(pvVar4);
  std::
  __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_28);
  Value = std::istream::gcount();
  dst = readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
  pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)&status,0);
  moveIntoDataSpace(this,dst,pvVar4,(ulong)Value);
  std::
  __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_28);
  bVar1 = std::ios::bad();
  uVar2 = 0;
  if ((bVar1 & 1) != 0) {
    uVar2 = 0xffffffba;
  }
  ForthStack<unsigned_int>::setTop(&this->dStack,uVar2);
  ForthStack<unsigned_int>::setTop(&this->dStack,1,Value);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&status);
  std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>::~shared_ptr
            ((shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *)local_28);
  return;
}

Assistant:

void readFile() {
	REQUIRE_DSTACK_DEPTH(3, "READ-FILE");
	auto h = (dStack.getTop()); pop();
	auto f = GetFileHandle(h, "READ-FILE", errorReadFile);
	auto length = SIZE_T(dStack.getTop());
	auto caddr = (dStack.getTop(1));
	std::vector<char> readBuffer(length);
	f->clear();
	f->read(&readBuffer[0], static_cast<std::streamsize>(length));
	auto status = f->rdstate();
	auto realLength = static_cast<Cell>(std::strlen(&readBuffer[0]));
	auto realLengthF = CELL(f->gcount());
	moveIntoDataSpace(caddr, &readBuffer[0], realLengthF);
	dStack.setTop(f->bad() ? Cell(errorReadFile) : 0);
	dStack.setTop(1, realLengthF);
}